

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposer.cpp
# Opt level: O0

void test_interval(int gid,DiscreteBounds *param_2,DiscreteBounds *bounds,DiscreteBounds *param_4,
                  RegularGridLink *param_5)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  ExprLhs<const_int_&> *this;
  const_reference piVar1;
  ExprLhs<const_int_&> EVar2;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  ITransientExpression *in_stack_fffffffffffffc88;
  AssertionHandler *in_stack_fffffffffffffc90;
  AssertionHandler *this_00;
  StringRef *in_stack_fffffffffffffc98;
  AssertionHandler *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  SourceLineInfo *this_01;
  size_type in_stack_fffffffffffffcb0;
  int *in_stack_fffffffffffffcc0;
  SourceLineInfo *this_02;
  ExprLhs<const_int_&> *in_stack_fffffffffffffcc8;
  AssertionHandler local_2c8;
  int *local_258;
  SourceLineInfo local_210;
  StringRef local_200;
  int *local_1a0;
  SourceLineInfo local_158;
  StringRef local_148;
  int *local_d8;
  SourceLineInfo local_90;
  StringRef local_80;
  
  local_80 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffc90,(size_t)in_stack_fffffffffffffc88);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x1b);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
  capturedExpression.m_size = in_stack_fffffffffffffcb0;
  capturedExpression.m_start = in_stack_fffffffffffffca8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (SourceLineInfo *)in_stack_fffffffffffffc90,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffc88 >> 0x20));
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
             (size_type)in_stack_fffffffffffffc88);
  local_d8 = (int *)Catch::Decomposer::operator<=
                              ((Decomposer *)in_stack_fffffffffffffc88,(int *)0x14858b);
  Catch::ExprLhs<int_const&>::operator==(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x1485e2);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc90);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc90);
  local_148 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffc90,(size_t)in_stack_fffffffffffffc88);
  this_02 = &local_158;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x1c);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
  capturedExpression_00.m_size = in_stack_fffffffffffffcb0;
  capturedExpression_00.m_start = in_stack_fffffffffffffca8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (SourceLineInfo *)in_stack_fffffffffffffc90,capturedExpression_00,
             (Flags)((ulong)in_stack_fffffffffffffc88 >> 0x20));
  this = (ExprLhs<const_int_&> *)
         itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                   ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
                    (size_type)in_stack_fffffffffffffc88);
  local_1a0 = (int *)Catch::Decomposer::operator<=
                               ((Decomposer *)in_stack_fffffffffffffc88,(int *)0x14870f);
  Catch::ExprLhs<int_const&>::operator==(this,(int *)this_02);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x148766);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc90);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc90);
  local_200 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffc90,(size_t)in_stack_fffffffffffffc88);
  this_01 = &local_210;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x1d);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
  capturedExpression_01.m_size = in_stack_fffffffffffffcb0;
  capturedExpression_01.m_start = (char *)this_01;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (SourceLineInfo *)in_stack_fffffffffffffc90,capturedExpression_01,
             (Flags)((ulong)in_stack_fffffffffffffc88 >> 0x20));
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffc90
                      ,(size_type)in_stack_fffffffffffffc88);
  EVar2 = Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffc88,(int *)0x1488d7);
  local_258 = EVar2.m_lhs;
  Catch::ExprLhs<int_const&>::operator==(this,(int *)this_02);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x14892e);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc90);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc90);
  local_2c8.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffc90,(size_t)in_stack_fffffffffffffc88);
  this_00 = &local_2c8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x1e);
  Catch::StringRef::StringRef((StringRef *)EVar2.m_lhs,(char *)in_stack_fffffffffffffc98);
  capturedExpression_02.m_size = (size_type)piVar1;
  capturedExpression_02.m_start = (char *)this_01;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)EVar2.m_lhs,in_stack_fffffffffffffc98,(SourceLineInfo *)this_00,
             capturedExpression_02,(Flags)((ulong)in_stack_fffffffffffffc88 >> 0x20));
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)this_00,
             (size_type)in_stack_fffffffffffffc88);
  EVar2 = Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffc88,(int *)0x148aa0);
  Catch::ExprLhs<int_const&>::operator==(this,(int *)this_02);
  Catch::AssertionHandler::handleExpr(this_00,(ITransientExpression *)EVar2.m_lhs);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x148ae6);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  return;
}

Assistant:

void  test_interval(int gid,
                    const diy::DiscreteBounds&,
                    const diy::DiscreteBounds& bounds,
                    const diy::DiscreteBounds&,
                    const diy::RegularGridLink&)
{
    REQUIRE(bounds.min[0] == gid);
    REQUIRE(bounds.max[0] == gid);
    REQUIRE(bounds.min[0] == gid);
    REQUIRE(bounds.max[0] == gid);
}